

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,unsigned_long *args,unsigned_long *args_1,int *args_2)

{
  Printer *this_00;
  char *pcVar1;
  int x;
  unsigned_long x_00;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_b1;
  char *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = this->printer_;
  local_b0 = format;
  ToString<unsigned_long,void>(&local_90,(Formatter *)*args,(unsigned_long)args);
  ToString<unsigned_long,void>(&local_70,(Formatter *)*args_1,x_00);
  ToString<int,void>(&local_50,(Formatter *)(ulong)(uint)*args_2,x);
  __l._M_len = 3;
  __l._M_array = &local_90;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a8,__l,&local_b1);
  io::Printer::FormatInternal(this_00,&local_a8,&this->vars_,local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  lVar2 = 0;
  do {
    pcVar1 = *(char **)((long)&local_50._M_dataplus._M_p + lVar2);
    if (local_50.field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x60);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }